

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O0

GLuint __thiscall
deqp::gles3::Functional::anon_unknown_0::BufferTfAttacher::getAttachment
          (BufferTfAttacher *this,GLuint tf)

{
  GLenum err;
  Functions *pFVar1;
  GLuint local_18;
  GLuint local_14;
  GLint ret;
  GLuint tf_local;
  BufferTfAttacher *this_local;
  
  local_18 = 0;
  local_14 = tf;
  _ret = this;
  pFVar1 = deqp::gls::LifetimeTests::details::ContextWrapper::gl
                     (&(this->super_Attacher).super_ContextWrapper);
  (*pFVar1->bindTransformFeedback)(0x8e22,local_14);
  pFVar1 = deqp::gls::LifetimeTests::details::ContextWrapper::gl
                     (&(this->super_Attacher).super_ContextWrapper);
  (*pFVar1->getIntegeri_v)(0x8c8f,0,(GLint *)&local_18);
  pFVar1 = deqp::gls::LifetimeTests::details::ContextWrapper::gl
                     (&(this->super_Attacher).super_ContextWrapper);
  (*pFVar1->bindTransformFeedback)(0x8e22,0);
  pFVar1 = deqp::gls::LifetimeTests::details::ContextWrapper::gl
                     (&(this->super_Attacher).super_ContextWrapper);
  err = (*pFVar1->getError)();
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                  ,0x15d);
  return local_18;
}

Assistant:

GLuint BufferTfAttacher::getAttachment (GLuint tf)
{
	GLint ret = 0;
	gl().bindTransformFeedback(GL_TRANSFORM_FEEDBACK, tf);
	gl().getIntegeri_v(GL_TRANSFORM_FEEDBACK_BUFFER_BINDING, 0, &ret);
	gl().bindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
	GLU_CHECK_ERROR(gl().getError());
	return GLuint(ret);
}